

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O3

void __thiscall
Gudhi::cubical_complex::
Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
~Bitmap_cubical_complex
          (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
           *this)

{
  pointer puVar1;
  
  (this->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base =
       (_func_int **)&PTR__Bitmap_cubical_complex_0012bb08;
  puVar1 = (this->sorted_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->sorted_cells).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->key_associated_to_simplex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->key_associated_to_simplex).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  Bitmap_cubical_complex_base<double>::~Bitmap_cubical_complex_base
            (&this->super_Bitmap_cubical_complex_base<double>);
  return;
}

Assistant:

virtual ~Bitmap_cubical_complex() {}